

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.hpp
# Opt level: O0

String __thiscall doctest::detail::fpToString<float>(detail *this,float value,int precision)

{
  _Setprecision _Var1;
  ostream *this_00;
  void *this_01;
  long lVar2;
  long lVar3;
  char *pcVar4;
  string local_1f0 [32];
  long local_1d0;
  size_t i;
  string d;
  ostringstream local_190 [8];
  ostringstream oss;
  int precision_local;
  float value_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  _Var1 = std::setprecision(precision);
  this_00 = std::operator<<((ostream *)local_190,_Var1);
  this_01 = (void *)std::ostream::operator<<(this_00,std::fixed);
  std::ostream::operator<<(this_01,value);
  std::__cxx11::ostringstream::str();
  lVar2 = std::__cxx11::string::find_last_not_of((char)&i,0x30);
  local_1d0 = lVar2;
  if (lVar2 != -1) {
    lVar3 = std::__cxx11::string::size();
    if (lVar2 != lVar3 + -1) {
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)&i);
      if (*pcVar4 == '.') {
        local_1d0 = local_1d0 + 1;
      }
      std::__cxx11::string::substr((ulong)local_1f0,(ulong)&i);
      std::__cxx11::string::operator=((string *)&i,local_1f0);
      std::__cxx11::string::~string(local_1f0);
    }
  }
  pcVar4 = (char *)std::__cxx11::string::c_str();
  String::String((String *)this,pcVar4);
  std::__cxx11::string::~string((string *)&i);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return (String)(char *)this;
}

Assistant:

String fpToString(T value, int precision) {
        std::ostringstream oss;
        oss << std::setprecision(precision) << std::fixed << value;
        std::string d = oss.str();
        size_t      i = d.find_last_not_of('0');
        if(i != std::string::npos && i != d.size() - 1) {
            if(d[i] == '.')
                i++;
            d = d.substr(0, i + 1);
        }
        return d.c_str();
    }